

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::FieldDescriptorCompare::operator()
          (FieldDescriptorCompare *this,FieldDescriptor *f1,FieldDescriptor *f2)

{
  string *__lhs;
  string *__rhs;
  FieldDescriptor *f2_local;
  FieldDescriptor *f1_local;
  FieldDescriptorCompare *this_local;
  
  if (f1 == (FieldDescriptor *)0x0) {
    this_local._7_1_ = false;
  }
  else if (f2 == (FieldDescriptor *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    __lhs = FieldDescriptor::full_name_abi_cxx11_(f1);
    __rhs = FieldDescriptor::full_name_abi_cxx11_(f2);
    this_local._7_1_ = std::operator<(__lhs,__rhs);
  }
  return this_local._7_1_;
}

Assistant:

bool operator ()(const FieldDescriptor* f1, const FieldDescriptor* f2) const {
    if(f1 == NULL) {
      return false;
    }
    if(f2 == NULL) {
      return true;
    }
    return f1->full_name() < f2->full_name();
  }